

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

UserData AllocUserData(void)

{
  UserData paVar1;
  sunrealtype **ppsVar2;
  sunindextype *psVar3;
  sunrealtype *psVar4;
  UserData data;
  int jy;
  int jx;
  int local_8;
  int local_4;
  
  paVar1 = (UserData)malloc(0x478);
  for (local_4 = 0; local_4 < 8; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 8; local_8 = local_8 + 1) {
      ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(6);
      paVar1->P[local_4][local_8] = ppsVar2;
      psVar3 = (sunindextype *)SUNDlsMat_newIndexArray(6);
      paVar1->pivot[local_4][local_8] = psVar3;
    }
  }
  ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(6);
  paVar1->acoef = ppsVar2;
  psVar4 = (sunrealtype *)malloc(0x30);
  paVar1->bcoef = psVar4;
  psVar4 = (sunrealtype *)malloc(0x30);
  paVar1->cox = psVar4;
  psVar4 = (sunrealtype *)malloc(0x30);
  paVar1->coy = psVar4;
  return paVar1;
}

Assistant:

static UserData AllocUserData(void)
{
  int jx, jy;
  UserData data;

  data = (UserData)malloc(sizeof *data);

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      (data->P)[jx][jy]     = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
      (data->pivot)[jx][jy] = SUNDlsMat_newIndexArray(NUM_SPECIES);
    }
  }

  acoef = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);
  bcoef = (sunrealtype*)malloc(NUM_SPECIES * sizeof(sunrealtype));
  cox   = (sunrealtype*)malloc(NUM_SPECIES * sizeof(sunrealtype));
  coy   = (sunrealtype*)malloc(NUM_SPECIES * sizeof(sunrealtype));

  return (data);
}